

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::Int64Option::help(Int64Option *this,bool verbose)

{
  byte in_SIL;
  long in_RDI;
  
  fprintf(_stderr,"  -%-12s = %-8s [",*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x20));
  if (*(long *)(in_RDI + 0x30) == -0x8000000000000000) {
    fprintf(_stderr,"imin");
  }
  else {
    fprintf(_stderr,"%4li",*(undefined8 *)(in_RDI + 0x30));
  }
  fprintf(_stderr," .. ");
  if (*(long *)(in_RDI + 0x38) == 0x7fffffffffffffff) {
    fprintf(_stderr,"imax");
  }
  else {
    fprintf(_stderr,"%4li",*(undefined8 *)(in_RDI + 0x38));
  }
  fprintf(_stderr,"] (default: %li)\n",*(undefined8 *)(in_RDI + 0x40));
  if ((in_SIL & 1) != 0) {
    fprintf(_stderr,"\n        %s\n",*(undefined8 *)(in_RDI + 0x10));
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help(bool verbose = false)
    {
        fprintf(stderr, "  -%-12s = %-8s [", name, type_name);
        if (range.begin == INT64_MIN)
            fprintf(stderr, "imin");
        else
            fprintf(stderr, "%4" PRIi64, range.begin);

        fprintf(stderr, " .. ");
        if (range.end == INT64_MAX)
            fprintf(stderr, "imax");
        else
            fprintf(stderr, "%4" PRIi64, range.end);

        fprintf(stderr, "] (default: %" PRIi64 ")\n", value);
        if (verbose) {
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }